

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proof.cc
# Opt level: O2

void __thiscall
gss::innards::Proof::create_cp_variable
          (Proof *this,int pattern_vertex,int target_size,
          function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(int)>
          *pattern_name,
          function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(int)>
          *target_name)

{
  _Head_base<0UL,_gss::innards::Proof::Imp_*,_false> _Var1;
  ostream *poVar2;
  mapped_type *pmVar3;
  ulong uVar4;
  uint __args;
  ulong uVar5;
  long n;
  long m;
  stringstream am1_constraint;
  stringstream al1_constraint;
  int local_3cc;
  Proof *local_3c8;
  uint local_3bc;
  pair<int,_int> local_3b8;
  tuple<long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3b0;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(int)>
  *local_380;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(int)>
  *local_378;
  long local_370;
  long local_368;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_360;
  undefined1 local_340 [392];
  undefined1 local_1b8 [392];
  
  local_3bc = ~(target_size >> 0x1f) & target_size;
  local_3cc = pattern_vertex;
  local_3c8 = this;
  local_380 = target_name;
  local_378 = pattern_name;
  for (__args = 0;
      _Var1._M_head_impl =
           (local_3c8->_imp)._M_t.
           super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
           ._M_t.
           super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
           .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl,
      local_3bc != __args; __args = __args + 1) {
    local_3b8.second = __args;
    local_3b8.first = local_3cc;
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(int)>
    ::operator()((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_3b0,
                 local_378,local_3cc);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_340,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_3b0,
                   "_");
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(int)>
    ::operator()(&local_360,local_380,__args);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_340,
                   &local_360);
    std::
    _Rb_tree<std::pair<long,long>,std::pair<std::pair<long,long>const,std::__cxx11::string>,std::_Select1st<std::pair<std::pair<long,long>const,std::__cxx11::string>>,std::less<std::pair<long,long>>,std::allocator<std::pair<std::pair<long,long>const,std::__cxx11::string>>>
    ::_M_emplace_unique<std::pair<int,int>,std::__cxx11::string>
              ((_Rb_tree<std::pair<long,long>,std::pair<std::pair<long,long>const,std::__cxx11::string>,std::_Select1st<std::pair<std::pair<long,long>const,std::__cxx11::string>>,std::less<std::pair<long,long>>,std::allocator<std::pair<std::pair<long,long>const,std::__cxx11::string>>>
                *)&(_Var1._M_head_impl)->variable_mappings,&local_3b8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8);
    std::__cxx11::string::~string((string *)local_1b8);
    std::__cxx11::string::~string((string *)&local_360);
    std::__cxx11::string::~string((string *)local_340);
    std::__cxx11::string::~string((string *)&local_3b0);
  }
  poVar2 = std::operator<<((ostream *)&(_Var1._M_head_impl)->field_0x50,"* vertex ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_3cc);
  std::operator<<(poVar2," domain\n");
  std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
  uVar5 = (ulong)local_3bc;
  for (uVar4 = 0; uVar5 != uVar4; uVar4 = uVar4 + 1) {
    poVar2 = std::operator<<((ostream *)(local_1b8 + 0x10),"1 x");
    local_340._0_8_ = SEXT48(local_3cc);
    local_340._8_8_ = uVar4;
    pmVar3 = std::
             map<std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&((local_3c8->_imp)._M_t.
                            super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                            .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)
                           ->variable_mappings,(key_type *)local_340);
    poVar2 = std::operator<<(poVar2,(string *)pmVar3);
    std::operator<<(poVar2," ");
  }
  std::operator<<((ostream *)(local_1b8 + 0x10),">= 1");
  _Var1._M_head_impl =
       (local_3c8->_imp)._M_t.
       super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
       ._M_t.
       super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
       .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl;
  std::__cxx11::stringbuf::str();
  poVar2 = std::operator<<((ostream *)&(_Var1._M_head_impl)->field_0x50,(string *)local_340);
  std::operator<<(poVar2," ;\n");
  std::__cxx11::string::~string((string *)local_340);
  local_360._M_dataplus._M_p._0_4_ = 0;
  local_360._M_dataplus._M_p._4_4_ = 0;
  _Var1._M_head_impl =
       (local_3c8->_imp)._M_t.
       super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
       ._M_t.
       super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
       .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl;
  local_3b8 = (pair<int,_int>)((_Var1._M_head_impl)->nb_constraints + 1);
  *(pair<int,_int> *)&(_Var1._M_head_impl)->nb_constraints = local_3b8;
  if ((_Var1._M_head_impl)->recover_encoding == false) {
    local_360._M_dataplus._M_p = (pointer)local_3b8;
  }
  std::__cxx11::stringbuf::str();
  std::
  tuple<long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  tuple<long_&,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
            ((tuple<long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_340,(long *)&local_3b8,(long *)&local_360,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_3b0);
  std::
  _Rb_tree<long,std::pair<long_const,std::tuple<long,long,std::__cxx11::string>>,std::_Select1st<std::pair<long_const,std::tuple<long,long,std::__cxx11::string>>>,std::less<long>,std::allocator<std::pair<long_const,std::tuple<long,long,std::__cxx11::string>>>>
  ::_M_emplace_unique<int&,std::tuple<long,long,std::__cxx11::string>>
            ((_Rb_tree<long,std::pair<long_const,std::tuple<long,long,std::__cxx11::string>>,std::_Select1st<std::pair<long_const,std::tuple<long,long,std::__cxx11::string>>>,std::less<long>,std::allocator<std::pair<long_const,std::tuple<long,long,std::__cxx11::string>>>>
              *)&(_Var1._M_head_impl)->at_least_one_value_constraints,&local_3cc,
             (tuple<long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_340);
  std::__cxx11::string::~string((string *)local_340);
  std::__cxx11::string::~string((string *)&local_3b0);
  std::__cxx11::stringstream::stringstream((stringstream *)local_340);
  for (uVar4 = 0; uVar5 != uVar4; uVar4 = uVar4 + 1) {
    poVar2 = std::operator<<((ostream *)(local_340 + 0x10),"-1 x");
    local_3b0.
    super__Tuple_impl<0UL,_long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .
    super__Tuple_impl<1UL,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .
    super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .
    super__Head_base<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
    ._M_head_impl._M_dataplus._M_p = (pointer)(long)local_3cc;
    local_3b0.
    super__Tuple_impl<0UL,_long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .
    super__Tuple_impl<1UL,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .
    super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .
    super__Head_base<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
    ._M_head_impl._M_string_length = uVar4;
    pmVar3 = std::
             map<std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&((local_3c8->_imp)._M_t.
                            super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                            .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)
                           ->variable_mappings,(key_type *)&local_3b0);
    poVar2 = std::operator<<(poVar2,(string *)pmVar3);
    std::operator<<(poVar2," ");
  }
  std::operator<<((ostream *)(local_340 + 0x10),">= -1");
  _Var1._M_head_impl =
       (local_3c8->_imp)._M_t.
       super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
       ._M_t.
       super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
       .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl;
  std::__cxx11::stringbuf::str();
  poVar2 = std::operator<<((ostream *)&(_Var1._M_head_impl)->field_0x50,(string *)&local_3b0);
  std::operator<<(poVar2," ;\n");
  std::__cxx11::string::~string((string *)&local_3b0);
  _Var1._M_head_impl =
       (local_3c8->_imp)._M_t.
       super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
       ._M_t.
       super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
       .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl;
  local_368 = (_Var1._M_head_impl)->nb_constraints + 1;
  (_Var1._M_head_impl)->nb_constraints = local_368;
  local_370 = 0;
  if ((_Var1._M_head_impl)->recover_encoding == false) {
    local_370 = local_368;
  }
  std::__cxx11::stringbuf::str();
  std::
  tuple<long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  tuple<long_&,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
            (&local_3b0,&local_368,&local_370,&local_360);
  std::
  _Rb_tree<long,std::pair<long_const,std::tuple<long,long,std::__cxx11::string>>,std::_Select1st<std::pair<long_const,std::tuple<long,long,std::__cxx11::string>>>,std::less<long>,std::allocator<std::pair<long_const,std::tuple<long,long,std::__cxx11::string>>>>
  ::_M_emplace_unique<int&,std::tuple<long,long,std::__cxx11::string>>
            ((_Rb_tree<long,std::pair<long_const,std::tuple<long,long,std::__cxx11::string>>,std::_Select1st<std::pair<long_const,std::tuple<long,long,std::__cxx11::string>>>,std::less<long>,std::allocator<std::pair<long_const,std::tuple<long,long,std::__cxx11::string>>>>
              *)&(_Var1._M_head_impl)->at_most_one_value_constraints,&local_3cc,&local_3b0);
  std::__cxx11::string::~string((string *)&local_3b0);
  std::__cxx11::string::~string((string *)&local_360);
  std::__cxx11::stringstream::~stringstream((stringstream *)local_340);
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
  return;
}

Assistant:

auto Proof::create_cp_variable(int pattern_vertex, int target_size,
    const function<auto(int)->string> & pattern_name,
    const function<auto(int)->string> & target_name) -> void
{
    for (int i = 0; i < target_size; ++i)
        _imp->variable_mappings.emplace(pair{pattern_vertex, i}, pattern_name(pattern_vertex) + "_" + target_name(i));

    _imp->model_stream << "* vertex " << pattern_vertex << " domain\n";
    stringstream al1_constraint;
    for (int i = 0; i < target_size; ++i)
        al1_constraint << "1 x" << _imp->variable_mappings[{pattern_vertex, i}] << " ";
    al1_constraint << ">= 1";
    _imp->model_stream << al1_constraint.str() << " ;\n";
    long n = ++_imp->nb_constraints;
    _imp->at_least_one_value_constraints.emplace(pattern_vertex, tuple{n, _imp->recover_encoding ? 0 : n, al1_constraint.str()});

    stringstream am1_constraint;
    for (int i = 0; i < target_size; ++i)
        am1_constraint << "-1 x" << _imp->variable_mappings[{pattern_vertex, i}] << " ";
    am1_constraint << ">= -1";
    _imp->model_stream << am1_constraint.str() << " ;\n";
    long m = ++_imp->nb_constraints;
    _imp->at_most_one_value_constraints.emplace(pattern_vertex, tuple{m, _imp->recover_encoding ? 0 : m, am1_constraint.str()});
}